

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk_conflict * lair_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool quest;
  ushort uVar1;
  undefined2 uVar2;
  connector *join;
  bool bVar3;
  wchar_t y0;
  dun_data *pdVar4;
  _Bool _Var5;
  int16_t iVar6;
  uint32_t uVar7;
  uint uVar8;
  wchar_t wVar9;
  wchar_t y0_00;
  uint32_t uVar10;
  wchar_t wVar11;
  void *p_00;
  connector *pcVar12;
  chunk *c;
  chunk *c_00;
  char *pcVar13;
  cave_profile *pcVar14;
  chunk *c_01;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong in_R8;
  wchar_t in_R9D;
  int iVar18;
  int iVar19;
  wchar_t wVar20;
  int iVar21;
  wchar_t wVar22;
  undefined1 reflect;
  
  uVar7 = Rand_div(10);
  if (dun->quest == false) {
    uVar8 = (int)(p->depth / 0x18) + uVar7 + 1;
    if ((int)uVar8 < 2) {
      iVar18 = 0x46;
    }
    else if (uVar8 == 2) {
      iVar18 = 0x4b;
    }
    else if (uVar8 < 4) {
      iVar18 = 0x50;
    }
    else if (uVar8 == 4) {
      iVar18 = 0x55;
    }
    else {
      iVar18 = (uint)(5 < uVar8) * 5 + 0x5a;
    }
  }
  else {
    iVar18 = 0x5f;
  }
  uVar1 = z_info->dungeon_hgt;
  uVar7 = Rand_div(10);
  wVar20 = (int)((uVar7 + iVar18) * (uint)uVar1) / 100;
  uVar1 = z_info->dungeon_wid;
  uVar7 = Rand_div(10);
  pdVar4 = dun;
  wVar22 = (wchar_t)in_R8;
  wVar9 = (int)((uVar7 + iVar18) * (uint)uVar1) / 100;
  wVar11 = min_height;
  if (min_height < wVar20) {
    wVar11 = wVar20;
  }
  if ((int)(uint)z_info->dungeon_hgt <= wVar11) {
    wVar11 = (uint)z_info->dungeon_hgt;
  }
  if (min_width < wVar9) {
    min_width = wVar9;
  }
  if ((int)(uint)z_info->dungeon_wid <= min_width) {
    min_width = (uint)z_info->dungeon_wid;
  }
  join = dun->join;
  wVar9 = dun->profile->block_size;
  dun->block_hgt = wVar9;
  pdVar4->block_wid = wVar9;
  pdVar4->join = (connector *)0x0;
  if (pdVar4->persist == true) {
    iVar19 = min_width / 2;
    iVar18 = min_width / 0x14;
    if (L'c' < min_width) {
      iVar18 = 5;
    }
    if (iVar18 < 0) {
      __assert_fail("range >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                    ,0x3e5,
                    "int find_joinfree_vertical_seam(const struct connector *, int, int, int, int)")
      ;
    }
    min_height = iVar18 + L'\x01';
    p_00 = mem_zalloc((ulong)(iVar18 * 2 + 1));
    for (pcVar12 = join; wVar22 = (wchar_t)in_R8, pcVar12 != (connector *)0x0;
        pcVar12 = pcVar12->next) {
      wVar9 = (pcVar12->grid).x;
      uVar17 = wVar9 - iVar19;
      uVar8 = -uVar17;
      if (0 < (int)uVar17) {
        uVar8 = uVar17;
      }
      in_R8 = (ulong)uVar8;
      if ((((int)uVar8 <= iVar18) && (wVar22 = (pcVar12->grid).y, L'\xffffffff' < wVar22)) &&
         (wVar22 < wVar11)) {
        *(undefined1 *)((long)p_00 + (long)(wVar9 + (iVar18 - iVar19))) = 1;
      }
    }
    uVar16 = 0;
    iVar21 = -1;
    while (iVar15 = (int)uVar16, SBORROW4(iVar15,iVar18 * 2) != iVar15 + iVar18 * -2 < 0) {
      uVar16 = (long)iVar15 + 1;
      if (*(char *)((long)p_00 + (long)iVar15) == '\0') {
        if (*(char *)((long)p_00 + uVar16) == '\0') {
          wVar20 = iVar15 - iVar18;
          wVar9 = -wVar20;
          if (L'\0' < wVar20) {
            wVar9 = wVar20;
          }
          wVar20 = min_height;
          if (wVar9 <= min_height) {
            wVar20 = wVar9;
          }
          bVar3 = wVar9 < min_height;
          min_height = wVar20;
          if (bVar3) {
            iVar21 = iVar15 + (iVar19 - iVar18);
          }
        }
        else {
          uVar16 = (ulong)(iVar15 + 2);
        }
      }
    }
    mem_free(p_00);
    if (iVar21 < 3) {
      return (chunk_conflict *)0x0;
    }
    wVar9 = iVar21 + L'\x01';
    if (min_width - wVar9 < 4) {
      return (chunk_conflict *)0x0;
    }
  }
  else {
    if (join != (connector *)0x0) {
      __assert_fail("cached_join == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                    ,0xdee,"struct chunk *lair_gen(struct player *, int, int, const char **)");
    }
    wVar9 = min_width / 2;
  }
  reflect = (undefined1)min_height;
  uVar7 = Rand_div(2);
  y0_00 = L'\0';
  wVar20 = min_width - wVar9;
  y0 = wVar9;
  if (uVar7 == 0) {
    y0 = L'\0';
    y0_00 = wVar9;
    wVar20 = wVar9;
  }
  pcVar12 = transform_join_list(join,wVar11,wVar20,y0,wVar22,in_R9D,(_Bool)reflect);
  pdVar4 = dun;
  dun->join = pcVar12;
  wVar22 = (wchar_t)pdVar4->persist;
  c = (chunk *)modified_chunk(p,(int)p->depth,wVar11,wVar20,pdVar4->persist);
  cave_connectors_free(dun->join);
  dun->join = join;
  if (c == (chunk *)0x0) {
    pcVar13 = "modified chunk could not be created";
  }
  else {
    if (uVar7 == 0) {
      wVar9 = min_width - wVar9;
    }
    pcVar12 = transform_join_list(join,wVar11,wVar9,y0_00,wVar22,in_R9D,(_Bool)reflect);
    dun->join = pcVar12;
    c_00 = (chunk *)cavern_chunk((int)p->depth,wVar11,wVar9,pcVar12);
    cave_connectors_free(dun->join);
    dun->join = join;
    if (c_00 == (chunk *)0x0) {
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar13 = "cavern chunk could not be created";
    }
    else {
      uVar2 = p->depth;
      if ((ushort)(uVar2 - 0x21) < 0xffe5) {
        uVar7 = (uint)(5 < (short)uVar2) * 4 + 1;
      }
      else {
        uVar7 = (uint32_t)(byte)((uVar2 & 0xff) / 6);
      }
      _Var5 = new_player_spot((chunk_conflict *)c,p);
      if (_Var5) {
        uVar10 = Rand_div(4);
        for (iVar18 = uVar7 + 1 + uVar10; 0 < iVar18; iVar18 = iVar18 + -1) {
          pick_and_place_distant_monster(c,p->grid,L'\0',true,c->depth);
        }
        for (wVar9 = L'\0'; pcVar14 = dun->profile, wVar9 < (pcVar14->str).mag;
            wVar9 = wVar9 + L'\x01') {
          build_streamer((chunk_conflict *)c,L'\x11',(pcVar14->str).mc);
        }
        for (wVar9 = L'\0'; wVar9 < (pcVar14->str).qua; wVar9 = wVar9 + L'\x01') {
          build_streamer((chunk_conflict *)c,L'\x12',(pcVar14->str).qc);
          pcVar14 = dun->profile;
        }
        uVar1 = z_info->level_monster_min;
        uVar10 = Rand_div(0x14);
        do {
          set_pit_type(c_00->depth,L'\0');
          _Var5 = mon_restrict(dun->pit_type->name,c_00->depth,c_00->depth,true);
        } while (!_Var5);
        if ((player->opts).opt[0x18] == true) {
          msg("Monster lair - %s",dun->pit_type->name);
        }
        wVar9 = c_00->height / 2;
        wVar22 = c_00->width / 2;
        spread_monsters(c_00,dun->pit_type->name,c_00->depth,uVar7 + 1 + uVar10 + (uint)uVar1,wVar9,
                        wVar22,wVar9,wVar22,'\a');
        mon_restrict((char *)0x0,c_00->depth,c_00->depth,false);
        c_01 = (chunk *)cave_new(wVar11,min_width);
        c_01->depth = (int)p->depth;
        chunk_copy((chunk_conflict *)c_01,p,(chunk_conflict *)c,L'\0',y0,L'\0',false);
        chunk_copy((chunk_conflict *)c_01,p,(chunk_conflict *)c_00,L'\0',y0_00,L'\0',false);
        cave_free((chunk_conflict *)c);
        cave_free((chunk_conflict *)c_00);
        draw_rectangle(c_01,L'\0',L'\0',c_01->height + L'\xffffffff',c_01->width + L'\xffffffff',
                       L'\x16',L'\0',true);
        ensure_connectedness((chunk_conflict *)c_01,true);
        _Var5 = dun->persist;
        quest = dun->quest;
        wVar11 = rand_range(3,4);
        wVar9 = rand_range(1,2);
        handle_level_stairs((chunk_conflict *)c_01,_Var5,quest,wVar11,wVar9);
        uVar10 = Rand_div(uVar7);
        alloc_objects((chunk_conflict *)c_01,L'\x01',L'\0',uVar10 + L'\x01',c_01->depth,'\0');
        uVar7 = Rand_div(uVar7);
        alloc_objects((chunk_conflict *)c_01,L'\x01',L'\x01',(int)(uVar7 + 1) / 5,c_01->depth,'\0');
        iVar6 = Rand_normal((uint)z_info->room_item_av,3);
        alloc_objects((chunk_conflict *)c_01,L'\x02',L'\x03',(int)iVar6,c_01->depth,'\x01');
        iVar6 = Rand_normal((uint)z_info->both_item_av,3);
        alloc_objects((chunk_conflict *)c_01,L'\x03',L'\x03',(int)iVar6,c_01->depth,'\x01');
        iVar6 = Rand_normal((uint)z_info->both_gold_av,3);
        alloc_objects((chunk_conflict *)c_01,L'\x03',L'\x02',(int)iVar6,c_01->depth,'\x01');
        return (chunk_conflict *)c_01;
      }
      uncreate_artifacts((chunk_conflict *)c_00);
      cave_free((chunk_conflict *)c_00);
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar13 = "could not place player";
    }
  }
  *p_error = pcVar13;
  return (chunk_conflict *)0x0;
}

Assistant:

struct chunk *lair_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	int size_percent, y_size, x_size;
	int left_width, normal_width, lair_width;
	int normal_offset, lair_offset;
	struct chunk *c;
	struct chunk *normal;
	struct chunk *lair;
	struct connector *cached_join;

	/* Scale the level */
	i = randint1(10) + p->depth / 24;
	if (dun->quest) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;
	y_size = z_info->dungeon_hgt * (size_percent - 5 + randint0(10)) / 100;
	x_size = z_info->dungeon_wid * (size_percent - 5 + randint0(10)) / 100;

	/* Enforce dimension limits */
	y_size = MIN(MAX(y_size, min_height), z_info->dungeon_hgt);
	x_size = MIN(MAX(x_size, min_width), z_info->dungeon_wid);

	/* Set the block height and width */
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;

	cached_join = dun->join;
	dun->join = NULL;
	if (dun->persist) {
		left_width = 1 + find_joinfree_vertical_seam(cached_join,
			x_size / 2, MIN(5, x_size / 20), 0, y_size - 1);
		if (left_width < 4 || x_size - left_width < 4) return NULL;
	} else {
		assert(cached_join == NULL);
		left_width = x_size / 2;
	}
	if (one_in_(2)) {
		/* Place the normal part on the left. */
		normal_width = left_width;
		normal_offset = 0;
		lair_width = x_size - left_width;
		lair_offset = left_width;
	} else {
		/* Place the lair part on the left. */
		normal_width = x_size - left_width;
		normal_offset = left_width;
		lair_width = left_width;
		lair_offset = 0;
	}

	/*
	 * The transformation applied here should match that for chunk_copy()
	 * below.
	 */
	dun->join = transform_join_list(cached_join, y_size, normal_width,
		0, normal_offset, 0, false);
	normal = modified_chunk(p, p->depth, y_size, normal_width,
		dun->persist);
	/* Done with the transformed connector information. */
	cave_connectors_free(dun->join);
	dun->join = cached_join;
	if (!normal) {
		*p_error = "modified chunk could not be created";
		return NULL;
	}

	/*
	 * The transformation applied here should match that for chunk_copy()
	 * below.
	 */
	dun->join = transform_join_list(cached_join, y_size, lair_width,
		0, lair_offset, 0, false);
	lair = cavern_chunk(p->depth, y_size, lair_width, dun->join);
	/* Done with the transformed connector information. */
	cave_connectors_free(dun->join);
	dun->join = cached_join;
	if (!lair) {
		uncreate_artifacts(normal);
		wipe_mon_list(normal, p);
		cave_free(normal);
		*p_error = "cavern chunk could not be created";
		return NULL;
	}

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(p->depth / 3, 10), 2) / 2;

	/* Put the character in the normal half */
	if (!new_player_spot(normal, p)) {
		uncreate_artifacts(lair);
		cave_free(lair);
		uncreate_artifacts(normal);
		wipe_mon_list(normal, p);
		cave_free(normal);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a smallish number of monsters for the normal half */
	i = randint1(4) + k;

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(normal, p->grid, 0, true,
			normal->depth);
	}

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(normal, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(normal, FEAT_QUARTZ, dun->profile->str.qc);

	/* Pick a larger number of monsters for the lair */
	i = (z_info->level_monster_min + randint1(20) + k);

	/* Find appropriate monsters */
	while (true) {
		/* Choose a pit profile */
		set_pit_type(lair->depth, 0);

		/* Set monster generation restrictions */
		if (mon_restrict(dun->pit_type->name, lair->depth, lair->depth, true))
			break;
	}

	ROOM_LOG("Monster lair - %s", dun->pit_type->name);

	/* Place lair monsters */
	spread_monsters(lair, dun->pit_type->name, lair->depth, i, lair->height / 2,
					lair->width / 2, lair->height / 2, lair->width / 2, 
					ORIGIN_CAVERN);

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, lair->depth, lair->depth, false);

	/* Make the level */
	c = cave_new(y_size, x_size);
	c->depth = p->depth;
	chunk_copy(c, p, normal, 0, normal_offset, 0, false);
	chunk_copy(c, p, lair, 0, lair_offset, 0, false);

	/* Free the chunks */
	cave_free(normal);
	cave_free(lair);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect */
	ensure_connectedness(c, true);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, dun->quest,
		rand_range(3, 4), rand_range(1, 2));

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}